

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

nifti_image * nifti_simple_init_nim(void)

{
  nifti_1_header nhdr;
  nifti_image *pnVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined1 in_stack_fffffffffffffd38 [344];
  undefined4 local_168 [9];
  undefined1 local_142;
  undefined8 local_140;
  undefined4 local_122;
  undefined8 local_11c;
  undefined8 uStack_114;
  undefined4 local_10;
  
  bVar5 = 0;
  memset(local_168,0,0x158);
  local_168[0] = 0x15c;
  local_142 = 0x72;
  local_140 = 0x1000100010003;
  local_11c = 0x3f80000000000000;
  uStack_114 = 0x3f8000003f800000;
  local_122 = 0x200010;
  local_10 = 0x312b6e;
  puVar3 = (undefined8 *)local_168;
  puVar4 = (undefined8 *)&stack0xfffffffffffffd38;
  for (lVar2 = 0x2b; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  nhdr.magic[0] = 'n';
  nhdr.magic[1] = '+';
  nhdr.magic[2] = '1';
  nhdr.magic[3] = '\0';
  nhdr.sizeof_hdr = in_stack_fffffffffffffd38._0_4_;
  nhdr.data_type[0] = in_stack_fffffffffffffd38[4];
  nhdr.data_type[1] = in_stack_fffffffffffffd38[5];
  nhdr.data_type[2] = in_stack_fffffffffffffd38[6];
  nhdr.data_type[3] = in_stack_fffffffffffffd38[7];
  nhdr.data_type[4] = in_stack_fffffffffffffd38[8];
  nhdr.data_type[5] = in_stack_fffffffffffffd38[9];
  nhdr.data_type[6] = in_stack_fffffffffffffd38[10];
  nhdr.data_type[7] = in_stack_fffffffffffffd38[0xb];
  nhdr.data_type[8] = in_stack_fffffffffffffd38[0xc];
  nhdr.data_type[9] = in_stack_fffffffffffffd38[0xd];
  nhdr.db_name[0] = in_stack_fffffffffffffd38[0xe];
  nhdr.db_name[1] = in_stack_fffffffffffffd38[0xf];
  nhdr.db_name[2] = in_stack_fffffffffffffd38[0x10];
  nhdr.db_name[3] = in_stack_fffffffffffffd38[0x11];
  nhdr.db_name[4] = in_stack_fffffffffffffd38[0x12];
  nhdr.db_name[5] = in_stack_fffffffffffffd38[0x13];
  nhdr.db_name[6] = in_stack_fffffffffffffd38[0x14];
  nhdr.db_name[7] = in_stack_fffffffffffffd38[0x15];
  nhdr.db_name[8] = in_stack_fffffffffffffd38[0x16];
  nhdr.db_name[9] = in_stack_fffffffffffffd38[0x17];
  nhdr.db_name[10] = in_stack_fffffffffffffd38[0x18];
  nhdr.db_name[0xb] = in_stack_fffffffffffffd38[0x19];
  nhdr.db_name[0xc] = in_stack_fffffffffffffd38[0x1a];
  nhdr.db_name[0xd] = in_stack_fffffffffffffd38[0x1b];
  nhdr.db_name[0xe] = in_stack_fffffffffffffd38[0x1c];
  nhdr.db_name[0xf] = in_stack_fffffffffffffd38[0x1d];
  nhdr.db_name[0x10] = in_stack_fffffffffffffd38[0x1e];
  nhdr.db_name[0x11] = in_stack_fffffffffffffd38[0x1f];
  nhdr.extents = in_stack_fffffffffffffd38._32_4_;
  nhdr.session_error = in_stack_fffffffffffffd38._36_2_;
  nhdr.regular = in_stack_fffffffffffffd38[0x26];
  nhdr.dim_info = in_stack_fffffffffffffd38[0x27];
  nhdr.dim[0] = in_stack_fffffffffffffd38._40_2_;
  nhdr.dim[1] = in_stack_fffffffffffffd38._42_2_;
  nhdr.dim[2] = in_stack_fffffffffffffd38._44_2_;
  nhdr.dim[3] = in_stack_fffffffffffffd38._46_2_;
  nhdr.dim[4] = in_stack_fffffffffffffd38._48_2_;
  nhdr.dim[5] = in_stack_fffffffffffffd38._50_2_;
  nhdr.dim[6] = in_stack_fffffffffffffd38._52_2_;
  nhdr.dim[7] = in_stack_fffffffffffffd38._54_2_;
  nhdr.intent_p1 = (float)in_stack_fffffffffffffd38._56_4_;
  nhdr.intent_p2 = (float)in_stack_fffffffffffffd38._60_4_;
  nhdr.intent_p3 = (float)in_stack_fffffffffffffd38._64_4_;
  nhdr.intent_code = in_stack_fffffffffffffd38._68_2_;
  nhdr.datatype = in_stack_fffffffffffffd38._70_2_;
  nhdr.bitpix = in_stack_fffffffffffffd38._72_2_;
  nhdr.slice_start = in_stack_fffffffffffffd38._74_2_;
  nhdr.pixdim[0] = (float)in_stack_fffffffffffffd38._76_4_;
  nhdr.pixdim[1] = (float)in_stack_fffffffffffffd38._80_4_;
  nhdr.pixdim[2] = (float)in_stack_fffffffffffffd38._84_4_;
  nhdr.pixdim[3] = (float)in_stack_fffffffffffffd38._88_4_;
  nhdr.pixdim[4] = (float)in_stack_fffffffffffffd38._92_4_;
  nhdr.pixdim[5] = (float)in_stack_fffffffffffffd38._96_4_;
  nhdr.pixdim[6] = (float)in_stack_fffffffffffffd38._100_4_;
  nhdr.pixdim[7] = (float)in_stack_fffffffffffffd38._104_4_;
  nhdr.vox_offset = (float)in_stack_fffffffffffffd38._108_4_;
  nhdr.scl_slope = (float)in_stack_fffffffffffffd38._112_4_;
  nhdr.scl_inter = (float)in_stack_fffffffffffffd38._116_4_;
  nhdr.slice_end = in_stack_fffffffffffffd38._120_2_;
  nhdr.slice_code = in_stack_fffffffffffffd38[0x7a];
  nhdr.xyzt_units = in_stack_fffffffffffffd38[0x7b];
  nhdr.cal_max = (float)in_stack_fffffffffffffd38._124_4_;
  nhdr.cal_min = (float)in_stack_fffffffffffffd38._128_4_;
  nhdr.slice_duration = (float)in_stack_fffffffffffffd38._132_4_;
  nhdr.toffset = (float)in_stack_fffffffffffffd38._136_4_;
  nhdr.glmax = in_stack_fffffffffffffd38._140_4_;
  nhdr.glmin = in_stack_fffffffffffffd38._144_4_;
  nhdr.descrip[0] = in_stack_fffffffffffffd38[0x94];
  nhdr.descrip[1] = in_stack_fffffffffffffd38[0x95];
  nhdr.descrip[2] = in_stack_fffffffffffffd38[0x96];
  nhdr.descrip[3] = in_stack_fffffffffffffd38[0x97];
  nhdr.descrip[4] = in_stack_fffffffffffffd38[0x98];
  nhdr.descrip[5] = in_stack_fffffffffffffd38[0x99];
  nhdr.descrip[6] = in_stack_fffffffffffffd38[0x9a];
  nhdr.descrip[7] = in_stack_fffffffffffffd38[0x9b];
  nhdr.descrip[8] = in_stack_fffffffffffffd38[0x9c];
  nhdr.descrip[9] = in_stack_fffffffffffffd38[0x9d];
  nhdr.descrip[10] = in_stack_fffffffffffffd38[0x9e];
  nhdr.descrip[0xb] = in_stack_fffffffffffffd38[0x9f];
  nhdr.descrip[0xc] = in_stack_fffffffffffffd38[0xa0];
  nhdr.descrip[0xd] = in_stack_fffffffffffffd38[0xa1];
  nhdr.descrip[0xe] = in_stack_fffffffffffffd38[0xa2];
  nhdr.descrip[0xf] = in_stack_fffffffffffffd38[0xa3];
  nhdr.descrip[0x10] = in_stack_fffffffffffffd38[0xa4];
  nhdr.descrip[0x11] = in_stack_fffffffffffffd38[0xa5];
  nhdr.descrip[0x12] = in_stack_fffffffffffffd38[0xa6];
  nhdr.descrip[0x13] = in_stack_fffffffffffffd38[0xa7];
  nhdr.descrip[0x14] = in_stack_fffffffffffffd38[0xa8];
  nhdr.descrip[0x15] = in_stack_fffffffffffffd38[0xa9];
  nhdr.descrip[0x16] = in_stack_fffffffffffffd38[0xaa];
  nhdr.descrip[0x17] = in_stack_fffffffffffffd38[0xab];
  nhdr.descrip[0x18] = in_stack_fffffffffffffd38[0xac];
  nhdr.descrip[0x19] = in_stack_fffffffffffffd38[0xad];
  nhdr.descrip[0x1a] = in_stack_fffffffffffffd38[0xae];
  nhdr.descrip[0x1b] = in_stack_fffffffffffffd38[0xaf];
  nhdr.descrip[0x1c] = in_stack_fffffffffffffd38[0xb0];
  nhdr.descrip[0x1d] = in_stack_fffffffffffffd38[0xb1];
  nhdr.descrip[0x1e] = in_stack_fffffffffffffd38[0xb2];
  nhdr.descrip[0x1f] = in_stack_fffffffffffffd38[0xb3];
  nhdr.descrip[0x20] = in_stack_fffffffffffffd38[0xb4];
  nhdr.descrip[0x21] = in_stack_fffffffffffffd38[0xb5];
  nhdr.descrip[0x22] = in_stack_fffffffffffffd38[0xb6];
  nhdr.descrip[0x23] = in_stack_fffffffffffffd38[0xb7];
  nhdr.descrip[0x24] = in_stack_fffffffffffffd38[0xb8];
  nhdr.descrip[0x25] = in_stack_fffffffffffffd38[0xb9];
  nhdr.descrip[0x26] = in_stack_fffffffffffffd38[0xba];
  nhdr.descrip[0x27] = in_stack_fffffffffffffd38[0xbb];
  nhdr.descrip[0x28] = in_stack_fffffffffffffd38[0xbc];
  nhdr.descrip[0x29] = in_stack_fffffffffffffd38[0xbd];
  nhdr.descrip[0x2a] = in_stack_fffffffffffffd38[0xbe];
  nhdr.descrip[0x2b] = in_stack_fffffffffffffd38[0xbf];
  nhdr.descrip[0x2c] = in_stack_fffffffffffffd38[0xc0];
  nhdr.descrip[0x2d] = in_stack_fffffffffffffd38[0xc1];
  nhdr.descrip[0x2e] = in_stack_fffffffffffffd38[0xc2];
  nhdr.descrip[0x2f] = in_stack_fffffffffffffd38[0xc3];
  nhdr.descrip[0x30] = in_stack_fffffffffffffd38[0xc4];
  nhdr.descrip[0x31] = in_stack_fffffffffffffd38[0xc5];
  nhdr.descrip[0x32] = in_stack_fffffffffffffd38[0xc6];
  nhdr.descrip[0x33] = in_stack_fffffffffffffd38[199];
  nhdr.descrip[0x34] = in_stack_fffffffffffffd38[200];
  nhdr.descrip[0x35] = in_stack_fffffffffffffd38[0xc9];
  nhdr.descrip[0x36] = in_stack_fffffffffffffd38[0xca];
  nhdr.descrip[0x37] = in_stack_fffffffffffffd38[0xcb];
  nhdr.descrip[0x38] = in_stack_fffffffffffffd38[0xcc];
  nhdr.descrip[0x39] = in_stack_fffffffffffffd38[0xcd];
  nhdr.descrip[0x3a] = in_stack_fffffffffffffd38[0xce];
  nhdr.descrip[0x3b] = in_stack_fffffffffffffd38[0xcf];
  nhdr.descrip[0x3c] = in_stack_fffffffffffffd38[0xd0];
  nhdr.descrip[0x3d] = in_stack_fffffffffffffd38[0xd1];
  nhdr.descrip[0x3e] = in_stack_fffffffffffffd38[0xd2];
  nhdr.descrip[0x3f] = in_stack_fffffffffffffd38[0xd3];
  nhdr.descrip[0x40] = in_stack_fffffffffffffd38[0xd4];
  nhdr.descrip[0x41] = in_stack_fffffffffffffd38[0xd5];
  nhdr.descrip[0x42] = in_stack_fffffffffffffd38[0xd6];
  nhdr.descrip[0x43] = in_stack_fffffffffffffd38[0xd7];
  nhdr.descrip[0x44] = in_stack_fffffffffffffd38[0xd8];
  nhdr.descrip[0x45] = in_stack_fffffffffffffd38[0xd9];
  nhdr.descrip[0x46] = in_stack_fffffffffffffd38[0xda];
  nhdr.descrip[0x47] = in_stack_fffffffffffffd38[0xdb];
  nhdr.descrip[0x48] = in_stack_fffffffffffffd38[0xdc];
  nhdr.descrip[0x49] = in_stack_fffffffffffffd38[0xdd];
  nhdr.descrip[0x4a] = in_stack_fffffffffffffd38[0xde];
  nhdr.descrip[0x4b] = in_stack_fffffffffffffd38[0xdf];
  nhdr.descrip[0x4c] = in_stack_fffffffffffffd38[0xe0];
  nhdr.descrip[0x4d] = in_stack_fffffffffffffd38[0xe1];
  nhdr.descrip[0x4e] = in_stack_fffffffffffffd38[0xe2];
  nhdr.descrip[0x4f] = in_stack_fffffffffffffd38[0xe3];
  nhdr.aux_file[0] = in_stack_fffffffffffffd38[0xe4];
  nhdr.aux_file[1] = in_stack_fffffffffffffd38[0xe5];
  nhdr.aux_file[2] = in_stack_fffffffffffffd38[0xe6];
  nhdr.aux_file[3] = in_stack_fffffffffffffd38[0xe7];
  nhdr.aux_file[4] = in_stack_fffffffffffffd38[0xe8];
  nhdr.aux_file[5] = in_stack_fffffffffffffd38[0xe9];
  nhdr.aux_file[6] = in_stack_fffffffffffffd38[0xea];
  nhdr.aux_file[7] = in_stack_fffffffffffffd38[0xeb];
  nhdr.aux_file[8] = in_stack_fffffffffffffd38[0xec];
  nhdr.aux_file[9] = in_stack_fffffffffffffd38[0xed];
  nhdr.aux_file[10] = in_stack_fffffffffffffd38[0xee];
  nhdr.aux_file[0xb] = in_stack_fffffffffffffd38[0xef];
  nhdr.aux_file[0xc] = in_stack_fffffffffffffd38[0xf0];
  nhdr.aux_file[0xd] = in_stack_fffffffffffffd38[0xf1];
  nhdr.aux_file[0xe] = in_stack_fffffffffffffd38[0xf2];
  nhdr.aux_file[0xf] = in_stack_fffffffffffffd38[0xf3];
  nhdr.aux_file[0x10] = in_stack_fffffffffffffd38[0xf4];
  nhdr.aux_file[0x11] = in_stack_fffffffffffffd38[0xf5];
  nhdr.aux_file[0x12] = in_stack_fffffffffffffd38[0xf6];
  nhdr.aux_file[0x13] = in_stack_fffffffffffffd38[0xf7];
  nhdr.aux_file[0x14] = in_stack_fffffffffffffd38[0xf8];
  nhdr.aux_file[0x15] = in_stack_fffffffffffffd38[0xf9];
  nhdr.aux_file[0x16] = in_stack_fffffffffffffd38[0xfa];
  nhdr.aux_file[0x17] = in_stack_fffffffffffffd38[0xfb];
  nhdr.qform_code = in_stack_fffffffffffffd38._252_2_;
  nhdr.sform_code = in_stack_fffffffffffffd38._254_2_;
  nhdr.quatern_b = (float)in_stack_fffffffffffffd38._256_4_;
  nhdr.quatern_c = (float)in_stack_fffffffffffffd38._260_4_;
  nhdr.quatern_d = (float)in_stack_fffffffffffffd38._264_4_;
  nhdr.qoffset_x = (float)in_stack_fffffffffffffd38._268_4_;
  nhdr.qoffset_y = (float)in_stack_fffffffffffffd38._272_4_;
  nhdr.qoffset_z = (float)in_stack_fffffffffffffd38._276_4_;
  nhdr.srow_x[0] = (float)in_stack_fffffffffffffd38._280_4_;
  nhdr.srow_x[1] = (float)in_stack_fffffffffffffd38._284_4_;
  nhdr.srow_x[2] = (float)in_stack_fffffffffffffd38._288_4_;
  nhdr.srow_x[3] = (float)in_stack_fffffffffffffd38._292_4_;
  nhdr.srow_y[0] = (float)in_stack_fffffffffffffd38._296_4_;
  nhdr.srow_y[1] = (float)in_stack_fffffffffffffd38._300_4_;
  nhdr.srow_y[2] = (float)in_stack_fffffffffffffd38._304_4_;
  nhdr.srow_y[3] = (float)in_stack_fffffffffffffd38._308_4_;
  nhdr.srow_z[0] = (float)in_stack_fffffffffffffd38._312_4_;
  nhdr.srow_z[1] = (float)in_stack_fffffffffffffd38._316_4_;
  nhdr.srow_z[2] = (float)in_stack_fffffffffffffd38._320_4_;
  nhdr.srow_z[3] = (float)in_stack_fffffffffffffd38._324_4_;
  nhdr.intent_name[0] = in_stack_fffffffffffffd38[0x148];
  nhdr.intent_name[1] = in_stack_fffffffffffffd38[0x149];
  nhdr.intent_name[2] = in_stack_fffffffffffffd38[0x14a];
  nhdr.intent_name[3] = in_stack_fffffffffffffd38[0x14b];
  nhdr.intent_name[4] = in_stack_fffffffffffffd38[0x14c];
  nhdr.intent_name[5] = in_stack_fffffffffffffd38[0x14d];
  nhdr.intent_name[6] = in_stack_fffffffffffffd38[0x14e];
  nhdr.intent_name[7] = in_stack_fffffffffffffd38[0x14f];
  nhdr.intent_name[8] = in_stack_fffffffffffffd38[0x150];
  nhdr.intent_name[9] = in_stack_fffffffffffffd38[0x151];
  nhdr.intent_name[10] = in_stack_fffffffffffffd38[0x152];
  nhdr.intent_name[0xb] = in_stack_fffffffffffffd38[0x153];
  nhdr.intent_name[0xc] = in_stack_fffffffffffffd38[0x154];
  nhdr.intent_name[0xd] = in_stack_fffffffffffffd38[0x155];
  nhdr.intent_name[0xe] = in_stack_fffffffffffffd38[0x156];
  nhdr.intent_name[0xf] = in_stack_fffffffffffffd38[0x157];
  pnVar1 = nifti_convert_nhdr2nim(nhdr,(char *)0x0);
  pnVar1->fname = (char *)0x0;
  pnVar1->iname = (char *)0x0;
  return pnVar1;
}

Assistant:

nifti_image* nifti_simple_init_nim(void)
{
  nifti_image *nim;
  struct nifti_1_header nhdr;
  int nbyper, swapsize;

   memset(&nhdr,0,sizeof(nhdr)) ;  /* zero out header, to be safe */

   nhdr.sizeof_hdr = sizeof(nhdr) ;
   nhdr.regular    = 'r' ;           /* for some stupid reason */

   nhdr.dim[0] = 3 ;
   nhdr.dim[1] = 1 ; nhdr.dim[2] = 1 ; nhdr.dim[3] = 1 ;
   nhdr.dim[4] = 0 ;

   nhdr.pixdim[0] = 0.0f ;
   nhdr.pixdim[1] = 1.0f ; nhdr.pixdim[2] = 1.0f ;
   nhdr.pixdim[3] = 1.0f ;

   nhdr.datatype = DT_FLOAT32 ;
   nifti_datatype_sizes( nhdr.datatype , &nbyper, &swapsize );
   nhdr.bitpix   = 8 * nbyper ;

   strcpy(nhdr.magic, "n+1");  /* init to single file */

   nim = nifti_convert_nhdr2nim(nhdr,NULL);
   nim->fname = NULL;
   nim->iname = NULL;
   return nim;
}